

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

string * Jupiter::Socket::ntop6_abi_cxx11_(in6_addr ip)

{
  char *pcVar1;
  string *in_RDI;
  undefined1 local_20 [16];
  
  pcVar1 = inet_ntop(10,local_20,ntop6::buf,0x2e);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (pcVar1 == (char *)0x0) {
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  else {
    strlen(ntop6::buf);
    std::__cxx11::string::_M_construct<char_const*>();
  }
  return in_RDI;
}

Assistant:

std::string Jupiter::Socket::ntop6(in_addr6 ip) {
	static char buf[46];
	if (inet_ntop(AF_INET6, &ip, buf, sizeof(buf)) == nullptr) {
		return {};
	}
	return std::string(buf);
}